

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  xmlChar xVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  xmlChar *pxVar8;
  bool bVar9;
  
  pxVar3 = ctxt->state;
  ppxVar1 = &pxVar3->value;
  iVar7 = (int)ppxVar1;
  if ((pxVar3->value == (xmlChar *)0x0) ||
     (pxVar4 = pxVar3->endvalue, pxVar6 = pxVar3->value, pxVar4 == (xmlChar *)0x0)) {
    *ppxVar1 = (xmlChar *)0x0;
    pxVar3->endvalue = (xmlChar *)0x0;
    return iVar7;
  }
  do {
    pxVar8 = pxVar6;
    pxVar6 = pxVar8 + 1;
  } while (*pxVar8 != '\0');
  bVar9 = pxVar8 == pxVar4;
  if (!bVar9) {
    xVar2 = *pxVar8;
    while (pxVar5 = pxVar6, xVar2 == '\0') {
      bVar9 = pxVar5 == pxVar4;
      if (bVar9) goto LAB_0018a4ae;
      pxVar6 = pxVar5 + 1;
      pxVar8 = pxVar5;
      xVar2 = *pxVar5;
    }
    if (!bVar9) {
      *ppxVar1 = pxVar8;
      return iVar7;
    }
  }
LAB_0018a4ae:
  *ppxVar1 = (xmlChar *)0x0;
  return iVar7;
}

Assistant:

static int
xmlRelaxNGNextValue(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlChar *cur;

    cur = ctxt->state->value;
    if ((cur == NULL) || (ctxt->state->endvalue == NULL)) {
        ctxt->state->value = NULL;
        ctxt->state->endvalue = NULL;
        return (0);
    }
    while (*cur != 0)
        cur++;
    while ((cur != ctxt->state->endvalue) && (*cur == 0))
        cur++;
    if (cur == ctxt->state->endvalue)
        ctxt->state->value = NULL;
    else
        ctxt->state->value = cur;
    return (0);
}